

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator-=(APInt *this,uint64_t RHS)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  APInt *pAVar4;
  uint64_t *puVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  pAVar4 = this;
  uVar3 = this->BitWidth;
  if ((ulong)uVar3 < 0x41) {
    puVar5 = (uint64_t *)((long)(this->U).pVal - RHS);
    (this->U).pVal = puVar5;
  }
  else {
    puVar5 = (this->U).pVal;
    uVar6 = (ulong)uVar3 + 0x3f >> 6;
    lVar7 = 0;
    do {
      puVar1 = puVar5 + lVar7;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - RHS;
      if (RHS <= uVar2) break;
      RHS = 1;
      bVar8 = uVar6 - 1 != lVar7;
      lVar7 = lVar7 + 1;
    } while (bVar8);
    this = (APInt *)((this->U).pVal + ((int)uVar6 - 1));
    puVar5 = (uint64_t *)(this->U).VAL;
  }
  (this->U).VAL = (ulong)((long)puVar5 << (-(char)uVar3 & 0x3fU)) >> (-(char)uVar3 & 0x3fU);
  return pAVar4;
}

Assistant:

APInt& APInt::operator-=(uint64_t RHS) {
  if (isSingleWord())
    U.VAL -= RHS;
  else
    tcSubtractPart(U.pVal, RHS, getNumWords());
  return clearUnusedBits();
}